

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O0

int interval_comp(int a,int b,int c,int d)

{
  int d_local;
  int c_local;
  int b_local;
  int a_local;
  
  if (a < c) {
    b_local = -1;
  }
  else if (c < a) {
    b_local = 1;
  }
  else if (b < d) {
    b_local = -1;
  }
  else if (d < b) {
    b_local = 1;
  }
  else {
    b_local = 0;
  }
  return b_local;
}

Assistant:

int interval_comp(int a, int b, int c, int d) {
    if (a < c) return -1;
    else if (a > c) return 1;
    else {
        if (b < d) return -1;
        else if (b > d) return 1;
        else return 0;
    }
}